

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

ScriptFunction * __thiscall
Js::JavascriptLibrary::CreateScriptFunction(JavascriptLibrary *this,FunctionProxy *proxy)

{
  Type TVar1;
  bool bVar2;
  ScriptFunctionType *pSVar3;
  Recycler *pRVar4;
  FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *this_00;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  bVar2 = FunctionProxy::IsClassConstructor(proxy);
  if (bVar2) {
    pSVar3 = FunctionProxy::GetUndeferredFunctionType(proxy);
    if (pSVar3 != (ScriptFunctionType *)0x0) {
      pSVar3 = FunctionProxy::GetUndeferredFunctionType(proxy);
      goto LAB_00aa34d8;
    }
  }
  pSVar3 = FunctionProxy::EnsureDeferredPrototypeType(proxy);
LAB_00aa34d8:
  TVar1 = ((proxy->functionInfo).ptr)->attributes;
  pRVar4 = this->recycler;
  if ((TVar1 >> 0x17 & 1) == 0) {
    if ((TVar1 >> 0x19 & 1) == 0) {
      local_50 = (undefined1  [8])&ScriptFunction::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_74a5554;
      data.filename._0_4_ = 0x18f2;
      pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,(TrackAllocData *)local_50);
      this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *)
                new<(Memory::ObjectInfoBits)1>
                          (0x48,pRVar4,
                           (InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27);
      ScriptFunction::ScriptFunction((ScriptFunction *)this_00,proxy,pSVar3);
    }
    else {
      local_50 = (undefined1  [8])&FunctionWithHomeObj<Js::ScriptFunction>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_74a5554;
      data.filename._0_4_ = 0x18ec;
      pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,(TrackAllocData *)local_50);
      this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *)
                new<(Memory::ObjectInfoBits)1>
                          (0x50,pRVar4,
                           (InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27);
      FunctionWithHomeObj<Js::ScriptFunction>::FunctionWithHomeObj
                ((FunctionWithHomeObj<Js::ScriptFunction> *)this_00,proxy,pSVar3);
    }
  }
  else if ((TVar1 >> 0x19 & 1) == 0) {
    local_50 = (undefined1  [8])&FunctionWithComputedName<Js::ScriptFunction>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x18f0;
    pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,(TrackAllocData *)local_50);
    this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *)
              new<(Memory::ObjectInfoBits)1>
                        (0x50,pRVar4,(InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27)
    ;
    FunctionWithComputedName<Js::ScriptFunction>::FunctionWithComputedName
              ((FunctionWithComputedName<Js::ScriptFunction> *)this_00,proxy,pSVar3);
  }
  else {
    local_50 = (undefined1  [8])
               &FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_74a5554;
    data.filename._0_4_ = 0x18e8;
    pRVar4 = Memory::Recycler::TrackAllocInfo(pRVar4,(TrackAllocData *)local_50);
    this_00 = (FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_> *)
              new<(Memory::ObjectInfoBits)1>
                        (0x58,pRVar4,(InfoBitsWrapper<(Memory::ObjectInfoBits)1> *)&data.field_0x27)
    ;
    FunctionWithComputedName<Js::FunctionWithHomeObj<Js::ScriptFunction>_>::FunctionWithComputedName
              (this_00,proxy,pSVar3);
  }
  return (ScriptFunction *)this_00;
}

Assistant:

ScriptFunction* JavascriptLibrary::CreateScriptFunction(FunctionProxy * proxy)
    {
        ScriptFunctionType * type = proxy->IsClassConstructor() && proxy->GetUndeferredFunctionType() ? proxy->GetUndeferredFunctionType() : proxy->EnsureDeferredPrototypeType();
        FunctionInfo* functionInfo = proxy->GetFunctionInfo();
        if (functionInfo->HasComputedName() || functionInfo->HasHomeObj())
        {
            if (functionInfo->HasComputedName() && functionInfo->HasHomeObj())
            {
                return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, FunctionWithComputedName<FunctionWithHomeObj<ScriptFunction>>, proxy, type);
            }
            else if (functionInfo->HasHomeObj())
            {
                return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, FunctionWithHomeObj<ScriptFunction>, proxy, type);
            }

            // Has computed Name
            return RecyclerNewWithInfoBits(this->GetRecycler(), EnumFunctionClass, ScriptFunctionWithComputedName, proxy, type);
        }
        return RecyclerNewEnumClass(this->GetRecycler(), EnumFunctionClass, ScriptFunction, proxy, type);
    }